

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O0

int __thiscall
CVmObjIterIdx::getp_get_next(CVmObjIterIdx *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long in_RCX;
  CVmObjIterIdx *in_RDX;
  vm_val_t *in_RDI;
  long idx;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  vm_val_t *in_stack_ffffffffffffffd0;
  
  if ((getp_get_next(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_next(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_next::desc,0);
    __cxa_guard_release(&getp_get_next(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_RDI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
  ;
  if (iVar1 == 0) {
    lVar2 = get_cur_index((CVmObjIterIdx *)0x3128a5);
    lVar2 = lVar2 + 1;
    lVar3 = get_last_valid((CVmObjIterIdx *)0x3128c2);
    if (lVar3 < lVar2) {
      err_throw(0);
    }
    get_indexed_val(in_RDX,in_RCX,in_stack_ffffffffffffffd0);
    set_cur_index(in_RDX,(vm_obj_id_t)((ulong)in_RCX >> 0x20),(long)in_stack_ffffffffffffffd0);
  }
  return 1;
}

Assistant:

int CVmObjIterIdx::getp_get_next(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the next index, which is one higher than the current index */
    long idx = get_cur_index() + 1;

    /* if the current value is out of range, throw an error */
    if (idx > get_last_valid())
        err_throw(VMERR_OUT_OF_RANGE);

    /* retrieve the value */
    get_indexed_val(vmg_ idx, retval);

    /* save the current index in our internal state */
    set_cur_index(vmg_ self, idx);

    /* handled */
    return TRUE;
}